

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<int>
               (char *label_id,int *xs,int *ys1,int *ys2,int count,int offset,int stride)

{
  undefined1 local_70 [8];
  GetterXsYs<int> getter2;
  GetterXsYs<int> getter1;
  int offset_local;
  int count_local;
  int *ys2_local;
  int *ys1_local;
  int *xs_local;
  char *label_id_local;
  
  GetterXsYs<int>::GetterXsYs((GetterXsYs<int> *)&getter2.Stride,xs,ys1,count,offset,stride);
  GetterXsYs<int>::GetterXsYs((GetterXsYs<int> *)local_70,xs,ys2,count,offset,stride);
  PlotShadedEx<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYs<int>>
            (label_id,(GetterXsYs<int> *)&getter2.Stride,(GetterXsYs<int> *)local_70);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys1, const T* ys2, int count, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys1, count, offset, stride);
    GetterXsYs<T> getter2(xs, ys2, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2);
}